

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_set_module_version(int major,int minor,int patch,char *tag)

{
  size_t sVar1;
  char *pcVar2;
  arg_dstr_t ds;
  
  s_mod_ver_major = major;
  s_mod_ver_minor = minor;
  s_mod_ver_patch = patch;
  free(s_mod_ver_tag);
  sVar1 = strlen(tag);
  pcVar2 = (char *)argtable3_xmalloc(sVar1 + 1);
  s_mod_ver_tag = pcVar2;
  memset(pcVar2,0,sVar1 + 1);
  memcpy(pcVar2,tag,sVar1);
  ds = arg_dstr_create();
  arg_dstr_catf(ds,"%d.",(ulong)(uint)s_mod_ver_major);
  arg_dstr_catf(ds,"%d.",(ulong)(uint)s_mod_ver_minor);
  arg_dstr_catf(ds,"%d.",(ulong)(uint)s_mod_ver_patch);
  arg_dstr_cat(ds,s_mod_ver_tag);
  free(s_mod_ver);
  sVar1 = strlen(ds->data);
  pcVar2 = (char *)argtable3_xmalloc(sVar1 + 1);
  s_mod_ver = pcVar2;
  memset(pcVar2,0,sVar1 + 1);
  memcpy(pcVar2,ds->data,sVar1);
  arg_dstr_destroy(ds);
  return;
}

Assistant:

void arg_set_module_version(int major, int minor, int patch, const char* tag) {
    size_t slen_tag, slen_ds;
    arg_dstr_t ds;

    s_mod_ver_major = major;
    s_mod_ver_minor = minor;
    s_mod_ver_patch = patch;

    xfree(s_mod_ver_tag);
    slen_tag = strlen(tag);
    s_mod_ver_tag = (char*)xmalloc(slen_tag + 1);
    memset(s_mod_ver_tag, 0, slen_tag + 1);

#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
    strncpy_s(s_mod_ver_tag, slen_tag + 1, tag, slen_tag);
#else
    memcpy(s_mod_ver_tag, tag, slen_tag);
#endif

    ds = arg_dstr_create();
    arg_dstr_catf(ds, "%d.", s_mod_ver_major);
    arg_dstr_catf(ds, "%d.", s_mod_ver_minor);
    arg_dstr_catf(ds, "%d.", s_mod_ver_patch);
    arg_dstr_cat(ds, s_mod_ver_tag);

    xfree(s_mod_ver);
    slen_ds = strlen(arg_dstr_cstr(ds));
    s_mod_ver = (char*)xmalloc(slen_ds + 1);
    memset(s_mod_ver, 0, slen_ds + 1);

#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
    strncpy_s(s_mod_ver, slen_ds + 1, arg_dstr_cstr(ds), slen_ds);
#else
    memcpy(s_mod_ver, arg_dstr_cstr(ds), slen_ds);
#endif

    arg_dstr_destroy(ds);
}